

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# judger.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  void *this;
  long lVar5;
  char *pcVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  int local_390;
  int local_38c;
  int j;
  int i_4;
  int rank [11];
  int local_354;
  int i_3;
  int i_2;
  _Self local_348;
  _Self local_340;
  _Self local_338;
  string local_330;
  undefined1 local_310 [8];
  string ppath;
  undefined1 local_2d0 [8];
  string pname;
  int iStack_2a8;
  int i_1;
  int id [11];
  _Self local_258;
  allocator local_249;
  key_type local_248;
  _Self local_228;
  allocator local_219;
  string local_218 [8];
  string replayFile;
  key_type local_1f0;
  _Self local_1d0;
  allocator local_1c1;
  key_type local_1c0;
  _Self local_1a0;
  int local_198;
  allocator local_191;
  int maxRounds;
  uint local_16c;
  iterator iStack_168;
  int playerNum;
  allocator local_159;
  key_type local_158;
  _Self local_138;
  key_type local_130;
  string local_110 [32];
  long local_f0;
  size_t pos;
  string local_e0 [8];
  string s;
  int i;
  undefined1 local_a8 [8];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  aipath;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parm;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&aipath._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_a8);
  if (argc == 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"AI9 2018 Judger");
    this = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_4142);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"-players=M      Set the number of players to M."
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "-rounds=R       Set the maximum round to R (optional, default is 3000)."
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "-replay=F       Set the replay file name to F (optional, default is replay.zip)."
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "-nameX=N        Set the name of player #X to N (optional, default is \"Attendant\")."
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "-pathX=P        Set the AI path of player #X to P.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"The range of X is from 0 to M-1.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Unrecognized parameters will be ignored.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Example. ./judger -players=3 -rounds=2000 -path0=ai0.so -path1=\"ai0.so\" -path2=\"ai/ai0.so\""
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
  }
  else {
    for (s.field_2._12_4_ = 1; (int)s.field_2._12_4_ < argc; s.field_2._12_4_ = s.field_2._12_4_ + 1
        ) {
      pcVar6 = argv[(int)s.field_2._12_4_];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,pcVar6,(allocator *)((long)&pos + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
      local_f0 = std::__cxx11::string::find((char)local_e0,0x3d);
      lVar5 = std::__cxx11::string::length();
      if (((lVar5 == 0) ||
          (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_e0), *pcVar6 != '-')) ||
         (local_f0 == -1)) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Parameter format incorrect!");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
        bVar1 = true;
      }
      else {
        std::__cxx11::string::substr((ulong)local_110,(ulong)local_e0);
        std::__cxx11::string::substr((ulong)&local_130,(ulong)local_e0);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_130);
        std::__cxx11::string::operator=((string *)pmVar7,local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string(local_110);
        bVar1 = false;
      }
      std::__cxx11::string::~string(local_e0);
      if (bVar1) goto LAB_0015afa2;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"players",&local_159);
    local_138._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_158);
    iStack_168 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = std::operator==(&local_138,&stack0xfffffffffffffe98);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Player count not given!");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&maxRounds,"players",&local_191);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)&maxRounds);
      uVar2 = std::__cxx11::stoi(pmVar7,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&maxRounds);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      local_16c = uVar2;
      if (((int)uVar2 < 2) || (8 < (int)uVar2)) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Player count out of range!");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
      else {
        local_198 = 0x44c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1c0,"rounds",&local_1c1);
        local_1a0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_1c0);
        local_1d0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar1 = std::operator!=(&local_1a0,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1f0,"rounds",
                     (allocator *)(replayFile.field_2._M_local_buf + 0xf));
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_1f0
                               );
          local_198 = std::__cxx11::stoi(pmVar7,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(replayFile.field_2._M_local_buf + 0xf));
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_218,"replay.zip",&local_219);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_248,"replay",&local_249);
        local_228._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_248);
        local_258._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar1 = std::operator!=(&local_228,&local_258);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)(id + 10),"replay",(allocator *)((long)id + 0x27));
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (key_type *)(id + 10));
          std::__cxx11::string::operator=(local_218,(string *)pmVar7);
          std::__cxx11::string::~string((string *)(id + 10));
          std::allocator<char>::~allocator((allocator<char> *)((long)id + 0x27));
        }
        pcVar6 = (char *)std::__cxx11::string::c_str();
        setReplayFile(pcVar6);
        init((EVP_PKEY_CTX *)(ulong)local_16c);
        id[6] = 0;
        id[7] = 0;
        id[8] = 0;
        id[2] = 0;
        id[3] = 0;
        id[4] = 0;
        id[5] = 0;
        _iStack_2a8 = 0;
        id[0] = 0;
        id[1] = 0;
        getPlayerIDs(&iStack_2a8);
        for (pname.field_2._12_4_ = 0; (int)pname.field_2._12_4_ < (int)local_16c;
            pname.field_2._12_4_ = pname.field_2._12_4_ + 1) {
          std::__cxx11::to_string((string *)((long)&ppath.field_2 + 8),pname.field_2._12_4_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2d0,"name",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&ppath.field_2 + 8));
          std::__cxx11::string::~string((string *)(ppath.field_2._M_local_buf + 8));
          std::__cxx11::to_string(&local_330,pname.field_2._12_4_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_310,"path",&local_330);
          std::__cxx11::string::~string((string *)&local_330);
          local_338._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (key_type *)local_310);
          local_340._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count);
          bVar1 = std::operator==(&local_338,&local_340);
          if (bVar1) {
            poVar4 = std::operator<<((ostream *)&std::cout,"AI path of player #");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,pname.field_2._12_4_);
            poVar4 = std::operator<<(poVar4," not specified!");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = 1;
            bVar1 = true;
          }
          else {
            local_348._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (key_type *)local_2d0);
            _i_3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count);
            bVar1 = std::operator==(&local_348,(_Self *)&i_3);
            if (bVar1) {
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                    (key_type *)local_2d0);
              std::__cxx11::string::operator=((string *)pmVar7,"Attendant");
            }
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  (key_type *)local_2d0);
            pmVar8 = std::
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&aipath._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  id + (long)(int)pname.field_2._12_4_ + -2);
            std::__cxx11::string::operator=((string *)pmVar8,(string *)pmVar7);
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  (key_type *)local_310);
            pmVar8 = std::
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_a8,id + (long)(int)pname.field_2._12_4_ + -2);
            std::__cxx11::string::operator=((string *)pmVar8,(string *)pmVar7);
            iVar3 = id[(long)(int)pname.field_2._12_4_ + -2];
            std::
            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&aipath._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         id + (long)(int)pname.field_2._12_4_ + -2);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            setPlayerName(iVar3,pcVar6);
            bVar1 = false;
          }
          std::__cxx11::string::~string((string *)local_310);
          std::__cxx11::string::~string((string *)local_2d0);
          if (bVar1) goto LAB_0015af86;
        }
        for (local_354 = 0; local_354 < (int)local_16c; local_354 = local_354 + 1) {
          std::
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_a8,id + (long)local_354 + -2);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          bVar1 = loadAI(pcVar6,id[(long)local_354 + -2]);
          if (!bVar1) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Failed to load ");
            pmVar8 = std::
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_a8,id + (long)local_354 + -2);
            poVar4 = std::operator<<(poVar4,(string *)pmVar8);
            poVar4 = std::operator<<(poVar4,"!");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = 1;
            goto LAB_0015af86;
          }
        }
        for (rank[10] = 0; rank[10] < local_198; rank[10] = rank[10] + 1) {
          invokeAI();
          run();
          iVar3 = checkWin();
          if (iVar3 != -1) break;
        }
        rank[6] = 0;
        rank[7] = 0;
        rank[8] = 0;
        rank[2] = 0;
        rank[3] = 0;
        rank[4] = 0;
        rank[5] = 0;
        _j = 0;
        rank[0] = 0;
        rank[1] = 0;
        getRank(&j);
        for (local_38c = 0; local_38c < (int)local_16c; local_38c = local_38c + 1) {
          for (local_390 = 0; local_390 < (int)local_16c; local_390 = local_390 + 1) {
            if ((&j)[local_38c] == id[(long)local_390 + -2]) {
              poVar4 = (ostream *)std::ostream::operator<<(&std::cout,local_390);
              std::operator<<(poVar4," ");
              break;
            }
          }
        }
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        closeReplayFile();
        argv_local._4_4_ = 0;
LAB_0015af86:
        std::__cxx11::string::~string(local_218);
      }
    }
  }
LAB_0015afa2:
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_a8);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&aipath._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&name._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    map<string, string> parm;
    map<int, string> name, aipath;

    if (argc == 1)
    {
        cout << "AI9 2018 Judger" << endl << endl;
        cout << "Parameters：" << endl;
        cout << "-players=M      Set the number of players to M." << endl;
        cout << "-rounds=R       Set the maximum round to R (optional, default is 3000)." << endl;
        cout << "-replay=F       Set the replay file name to F (optional, default is replay.zip)." << endl;
        cout << "-nameX=N        Set the name of player #X to N (optional, default is \"Attendant\")." << endl;
        cout << "-pathX=P        Set the AI path of player #X to P." << endl;
        cout << endl;
        cout << "The range of X is from 0 to M-1." << endl;
        cout << "Unrecognized parameters will be ignored." << endl;
        cout << endl;
#if defined(_WIN32)
        cout << "Example. ./judger -players=3 -rounds=2000 -path0=ai0.dll -path1=\"ai0.dll\" -path2=\"ai/ai0.dll\"" << endl;
#elif defined(__APPLE__)
        cout << "Example. ./judger -players=3 -rounds=2000 -path0=ai0.dylib -path1=\"ai0.dylib\" -path2=\"ai/ai0.dylib\"" << endl;
#else
        cout << "Example. ./judger -players=3 -rounds=2000 -path0=ai0.so -path1=\"ai0.so\" -path2=\"ai/ai0.so\"" << endl;
#endif
        return 0;
    }

    for (int i = 1; i < argc; ++i)
    {
        string s(argv[i]);
        size_t pos = s.find('=');
        if (s.length() == 0 || s[0] != '-' || pos == string::npos)
        {
            cout << "Parameter format incorrect!" << endl;
            return 1;
        }
        parm[s.substr(1, pos - 1)] = s.substr(pos + 1);
    }

    if (parm.find("players") == parm.end())
    {
        cout << "Player count not given!" << endl;
        return 1;
    }
    int playerNum = stoi(parm["players"]);
    if (playerNum < 2 || playerNum > 8)
    {
        cout << "Player count out of range!" << endl;
        return 1;
    }

    int maxRounds = 1100;
    if (parm.find("rounds") != parm.end())
        maxRounds = stoi(parm["rounds"]);

    string replayFile("replay.zip");
    if (parm.find("replay") != parm.end())
        replayFile = parm["replay"];

    setReplayFile(replayFile.c_str());

    init(playerNum);
    int id[MAXPLAYERNUM + 5] = {0};
    getPlayerIDs(id);

    for (int i = 0; i < playerNum; ++i)
    {
        string pname = "name" + to_string(i);
        string ppath = "path" + to_string(i);
        if (parm.find(ppath) == parm.end())
        {
            cout << "AI path of player #" << i << " not specified!" << endl;
            return 1;
        }
        if (parm.find(pname) == parm.end())
            parm[pname] = "Attendant";
        name[id[i]] = parm[pname];
        aipath[id[i]] = parm[ppath];

        setPlayerName(id[i], name[id[i]].c_str());
    }

    for (int i = 0; i < playerNum; ++i)
        if (!loadAI(aipath[id[i]].c_str(), id[i]))
        {
            cout << "Failed to load " << aipath[id[i]] << "!" << endl;
            return 1;
        }

    for (int i = 0; i < maxRounds; ++i)
    {
        invokeAI();
        run();
        if (checkWin() != -1)
            break;
    }

    int rank[MAXPLAYERNUM + 5] = {0};
    getRank(rank);

    for (int i = 0; i < playerNum; ++i)
        for (int j = 0; j < playerNum; ++j)
            if (rank[i] == id[j])
            {
                cout << j << " ";
                break;
            }
    cout << endl;

    closeReplayFile();
    return 0;
}